

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::MeshLoader::loadNormalsSourceElement(MeshLoader *this,InputShared *input)

{
  MeshVertexData *pMVar1;
  pointer *ppAVar2;
  Mesh *pMVar3;
  bool bVar4;
  int iVar5;
  SourceBase *this_00;
  size_t sVar6;
  ostream *poVar7;
  Semantic semantic;
  String sourceId;
  URI inputUrl;
  Semantic local_12c;
  String local_128;
  undefined1 local_108 [232];
  
  local_12c = (input->super_InputUnshared).mSemantic;
  if (local_12c != NORMAL) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "The current input element is not a NORMAL element!");
    std::endl<char,std::char_traits<char>>(poVar7);
    return false;
  }
  COLLADABU::URI::URI((URI *)local_108,&(input->super_InputUnshared).mSource,false);
  std::__cxx11::string::string((string *)&local_128,(string *)(local_108 + 0xc0));
  this_00 = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_128);
  if ((this_00 != (SourceBase *)0x0) &&
     (bVar4 = SourceBase::isLoadedInputElement(this_00,&local_12c), !bVar4)) {
    iVar5 = (*this_00->_vptr_SourceBase[2])(this_00);
    if (iVar5 == 2) {
      pMVar3 = this->mMesh;
      pMVar1 = &pMVar3->mNormals;
      sVar6 = COLLADAFW::FloatOrDoubleArray::getValuesCount(&pMVar1->super_FloatOrDoubleArray);
      this_00->mInitialIndex = sVar6;
      (pMVar3->mNormals).super_FloatOrDoubleArray.mType = DATA_TYPE_FLOAT;
      if (sVar6 == 0) {
        COLLADAFW::FloatOrDoubleArray::setData
                  (&pMVar1->super_FloatOrDoubleArray,
                   *(float **)&this_00[1].mLoadedInputElements.mFlags,
                   (size_t)this_00[1].mAccessor.
                           super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        ppAVar2 = &this_00[1].mAccessor.
                   super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(byte *)ppAVar2 = *(byte *)ppAVar2 & 0xfc;
      }
      else {
        COLLADAFW::FloatOrDoubleArray::appendValues
                  (&pMVar1->super_FloatOrDoubleArray,
                   (FloatArray *)&this_00[1].mLoadedInputElements.mFlags);
      }
      bVar4 = true;
      SourceBase::addLoadedInputElement(this_00,&local_12c);
      goto LAB_0083c402;
    }
    if (iVar5 == 3) {
      pMVar3 = this->mMesh;
      pMVar1 = &pMVar3->mNormals;
      sVar6 = COLLADAFW::FloatOrDoubleArray::getValuesCount(&pMVar1->super_FloatOrDoubleArray);
      this_00->mInitialIndex = sVar6;
      (pMVar3->mNormals).super_FloatOrDoubleArray.mType = DATA_TYPE_DOUBLE;
      if (sVar6 == 0) {
        COLLADAFW::FloatOrDoubleArray::setData
                  (&pMVar1->super_FloatOrDoubleArray,
                   *(double **)&this_00[1].mLoadedInputElements.mFlags,
                   (size_t)this_00[1].mAccessor.
                           super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        ppAVar2 = &this_00[1].mAccessor.
                   super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(byte *)ppAVar2 = *(byte *)ppAVar2 & 0xfc;
      }
      else {
        COLLADAFW::FloatOrDoubleArray::appendValues
                  (&pMVar1->super_FloatOrDoubleArray,
                   (DoubleArray *)&this_00[1].mLoadedInputElements.mFlags);
      }
      bVar4 = true;
      SourceBase::addLoadedInputElement(this_00,&local_12c);
      goto LAB_0083c402;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Normals source has an other datatype as float or double! ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  bVar4 = false;
LAB_0083c402:
  std::__cxx11::string::~string((string *)&local_128);
  COLLADABU::URI::~URI((URI *)local_108);
  return bVar4;
}

Assistant:

bool MeshLoader::loadNormalsSourceElement ( const InputShared& input )
    {
        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        if ( semantic != InputSemantic::NORMAL )
        {
            std::cerr << "The current input element is not a NORMAL element!" << std::endl;
            return false;
        }

        // Get the source element with the uri of the input element.
        COLLADABU::URI inputUrl = input.getSource ();
        String sourceId = inputUrl.getFragment ();
        SourceBase* sourceBase = getSourceById ( sourceId );
        if ( sourceBase == 0 ) return false;

        // Check if the source element is already loaded.
        if ( sourceBase->isLoadedInputElement ( semantic ) ) return false;

        // Get the source input array
        const SourceBase::DataType& dataType = sourceBase->getDataType ();
        switch ( dataType )
        {
        case SourceBase::DATA_TYPE_FLOAT:
            {
                // Get the values array from the source
                FloatSource* source = ( FloatSource* ) sourceBase;
                FloatArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<float>& valuesArray = arrayElement.getValues ();

                // Check if there are already some values in the positions list.
                // If so, we have to store the last index to increment the following indexes.
                COLLADAFW::MeshVertexData& normals = mMesh->getNormals ();
                const size_t initialIndex = normals.getValuesCount ();
                sourceBase->setInitialIndex ( initialIndex );

                // Push the new positions into the list of positions.
                normals.setType ( COLLADAFW::MeshVertexData::DATA_TYPE_FLOAT );
                if ( initialIndex != 0 ) 
				{
					normals.appendValues ( valuesArray );
				}
                else 
				{
					normals.setData ( valuesArray.getData (), valuesArray.getCount () );
					valuesArray.yieldOwnerShip();
				}

                // Set the source base as loaded element.
                sourceBase->addLoadedInputElement ( semantic );

                break;
            }
        case SourceBase::DATA_TYPE_DOUBLE:
            {
                // Get the values array from the source
                DoubleSource* source = ( DoubleSource* ) sourceBase;
                DoubleArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<double>& valuesArray = arrayElement.getValues ();

                // Check if there are already some values in the positions list.
                // If so, we have to store the last index to increment the following indexes.
                COLLADAFW::MeshVertexData& normals = mMesh->getNormals ();
                const size_t initialIndex = normals.getValuesCount ();
                sourceBase->setInitialIndex ( initialIndex );

                // Push the new positions into the list of positions.
                normals.setType ( COLLADAFW::MeshVertexData::DATA_TYPE_DOUBLE );
                if ( initialIndex != 0 ) 
				{
					normals.appendValues ( valuesArray );
				}
                else 
				{ 
					normals.setData ( valuesArray.getData (), valuesArray.getCount () );
					valuesArray.yieldOwnerShip();
				}

                // Set the source base as loaded element.
                sourceBase->addLoadedInputElement ( semantic );

                break;
            }
        default:
            std::cerr << "Normals source has an other datatype as float or double! " << dataType << std::endl;
            return false;
        }

        return true;
    }